

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMutexTest.cpp
# Opt level: O1

void __thiscall
TEST_SimpleMutexTest_CreateAndDestroy_Test::testBody
          (TEST_SimpleMutexTest_CreateAndDestroy_Test *this)

{
  int iVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  char *pcVar4;
  char *pcVar5;
  SimpleString local_40;
  SimpleMutex mtx;
  
  SimpleMutex::SimpleMutex(&mtx);
  SimpleMutex::~SimpleMutex(&mtx);
  iVar1 = mutexCreateCount;
  pUVar2 = UtestShell::getCurrent();
  if (iVar1 == 1) {
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x56,pTVar3);
  }
  else {
    StringFrom((int)(SimpleString *)&mtx);
    pcVar4 = SimpleString::asCharString((SimpleString *)&mtx);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x56,pTVar3);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString((SimpleString *)&mtx);
  }
  iVar1 = mutexDestroyCount;
  pUVar2 = UtestShell::getCurrent();
  if (iVar1 == 1) {
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x57,pTVar3);
  }
  else {
    StringFrom((int)(SimpleString *)&mtx);
    pcVar4 = SimpleString::asCharString((SimpleString *)&mtx);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x57,pTVar3);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString((SimpleString *)&mtx);
  }
  iVar1 = mutexLockCount;
  pUVar2 = UtestShell::getCurrent();
  if (iVar1 == 0) {
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x58,pTVar3);
  }
  else {
    StringFrom((int)(SimpleString *)&mtx);
    pcVar4 = SimpleString::asCharString((SimpleString *)&mtx);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x58,pTVar3);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString((SimpleString *)&mtx);
  }
  iVar1 = mutexUnlockCount;
  pUVar2 = UtestShell::getCurrent();
  if (iVar1 == 0) {
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x59,pTVar3);
  }
  else {
    StringFrom((int)(SimpleString *)&mtx);
    pcVar4 = SimpleString::asCharString((SimpleString *)&mtx);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x59,pTVar3);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString((SimpleString *)&mtx);
  }
  return;
}

Assistant:

TEST(SimpleMutexTest, CreateAndDestroy)
{
    {
        SimpleMutex mtx;
    }

    CHECK_EQUAL(1, mutexCreateCount);
    CHECK_EQUAL(1, mutexDestroyCount);
    CHECK_EQUAL(0, mutexLockCount);
    CHECK_EQUAL(0, mutexUnlockCount);
}